

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr0.c
# Opt level: O1

void append_states(void)

{
  int iVar1;
  Yshort *pYVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  
  pYVar2 = shift_symbol;
  lVar3 = (long)nshifts;
  if (1 < lVar3) {
    lVar4 = 1;
    iVar5 = 2;
    do {
      iVar1 = pYVar2[lVar4];
      iVar6 = iVar5;
      do {
        uVar7 = iVar6 - 1;
        if (pYVar2[(ulong)uVar7 - 1] <= iVar1) goto LAB_0010db1c;
        pYVar2[uVar7] = pYVar2[(ulong)uVar7 - 1];
        iVar6 = iVar6 + -1;
      } while (1 < iVar6);
      uVar7 = 0;
LAB_0010db1c:
      pYVar2[(int)uVar7] = iVar1;
      lVar4 = lVar4 + 1;
      iVar5 = iVar5 + 1;
    } while (lVar4 != lVar3);
  }
  if (0 < nshifts) {
    lVar3 = 0;
    do {
      iVar5 = get_state(shift_symbol[lVar3]);
      shiftset[lVar3] = iVar5;
      lVar3 = lVar3 + 1;
    } while (lVar3 < nshifts);
  }
  return;
}

Assistant:

void append_states()
{
    register int i;
    register int j;
    register int symbol;

#ifdef	TRACE
    fprintf(stderr, "Entering append_states()\n");
#endif
    for (i = 1; i < nshifts; i++)
    {
	symbol = shift_symbol[i];
	j = i;
	while (j > 0 && shift_symbol[j - 1] > symbol)
	{
	    shift_symbol[j] = shift_symbol[j - 1];
	    j--;
	}
	shift_symbol[j] = symbol;
    }

    for (i = 0; i < nshifts; i++)
    {
	symbol = shift_symbol[i];
	shiftset[i] = get_state(symbol);
    }
}